

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.hpp
# Opt level: O2

Octant * __thiscall
unibn::Octree<Point3f,_std::vector<Point3f,_std::allocator<Point3f>_>_>::createOctant
          (Octree<Point3f,_std::vector<Point3f,_std::allocator<Point3f>_>_> *this,float x,float y,
          float z,float extent,uint32_t startIdx,uint32_t endIdx,uint32_t size)

{
  int *piVar1;
  float fVar2;
  uint32_t size_00;
  pointer pPVar3;
  pointer puVar4;
  uint uVar5;
  Octant *pOVar6;
  Octant *pOVar7;
  uint32_t *puVar8;
  ulong uVar9;
  pointer puVar10;
  uint uVar11;
  uint32_t i;
  ulong uVar12;
  bool bVar13;
  allocator_type local_91;
  vector<Point3f,_std::allocator<Point3f>_> *local_90;
  value_type_conflict local_84;
  vector<unsigned_int,_std::allocator<unsigned_int>_> childSizes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> childEnds;
  vector<unsigned_int,_std::allocator<unsigned_int>_> childStarts;
  
  pOVar6 = (Octant *)operator_new(0x60);
  pOVar6->child[0] = (Octant *)0x0;
  pOVar6->child[1] = (Octant *)0x0;
  pOVar6->child[2] = (Octant *)0x0;
  pOVar6->child[3] = (Octant *)0x0;
  pOVar6->child[4] = (Octant *)0x0;
  pOVar6->child[5] = (Octant *)0x0;
  pOVar6->child[6] = (Octant *)0x0;
  pOVar6->child[7] = (Octant *)0x0;
  pOVar6->isLeaf = true;
  pOVar6->x = x;
  pOVar6->y = y;
  pOVar6->z = z;
  pOVar6->extent = extent;
  pOVar6->start = startIdx;
  pOVar6->end = endIdx;
  pOVar6->size = size;
  if (((this->params_).bucketSize < size) &&
     (fVar2 = (this->params_).minExtent, fVar2 + fVar2 < extent)) {
    pOVar6->isLeaf = false;
    local_90 = this->data_;
    childEnds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&childStarts,8,(value_type_conflict *)&childEnds,(allocator_type *)&childSizes);
    childSizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&childEnds,8,(value_type_conflict *)&childSizes,(allocator_type *)&local_84);
    local_84 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&childSizes,8,&local_84,&local_91);
    pPVar3 = (local_90->super__Vector_base<Point3f,_std::allocator<Point3f>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (this->successors_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    while (bVar13 = size != 0, size = size - 1, bVar13) {
      bVar13 = x < pPVar3[startIdx].x;
      uVar11 = bVar13 + 2;
      if (pPVar3[startIdx].y <= y) {
        uVar11 = (uint)bVar13;
      }
      uVar5 = uVar11 + 4;
      if (pPVar3[startIdx].z <= z) {
        uVar5 = uVar11;
      }
      uVar9 = (ulong)uVar5;
      if (*(int *)(CONCAT44(childSizes.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            childSizes.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_) + uVar9 * 4) == 0) {
        puVar10 = childStarts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar9;
      }
      else {
        puVar10 = puVar4 + *(uint *)(CONCAT44(childEnds.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                              childEnds.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                    uVar9 * 4);
      }
      *puVar10 = startIdx;
      piVar1 = (int *)(CONCAT44(childSizes.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                childSizes.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_) +
                      (ulong)(uVar5 << 2));
      *piVar1 = *piVar1 + 1;
      *(uint32_t *)
       (CONCAT44(childEnds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_,
                 childEnds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_) + (ulong)(uVar5 << 2)) = startIdx;
      startIdx = puVar4[startIdx];
    }
    local_90 = (vector<Point3f,_std::allocator<Point3f>_> *)CONCAT44(local_90._4_4_,extent * 0.5);
    bVar13 = true;
    uVar9 = 0;
    for (uVar12 = 0; uVar12 != 8; uVar12 = uVar12 + 1) {
      size_00 = *(uint32_t *)
                 (CONCAT44(childSizes.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           childSizes.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_) + uVar12 * 4);
      if (size_00 != 0) {
        pOVar7 = createOctant(this,createOctant::factor[(uint)uVar12 & 1] * extent + x,
                              *(float *)((long)createOctant::factor + (ulong)((uint)uVar12 & 2) * 2)
                              * extent + y,createOctant::factor[3 < uVar12] * extent + z,
                              local_90._0_4_,
                              childStarts.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar12],
                              *(uint32_t *)
                               (CONCAT44(childEnds.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         childEnds.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                               uVar12 * 4),size_00);
        pOVar6->child[uVar12] = pOVar7;
        puVar8 = &pOVar6->start;
        if (!bVar13) {
          puVar8 = (this->successors_).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start + pOVar6->child[uVar9]->end;
        }
        *puVar8 = pOVar7->start;
        pOVar6->end = pOVar7->end;
        bVar13 = false;
        uVar9 = uVar12 & 0xffffffff;
      }
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&childSizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&childEnds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&childStarts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  return pOVar6;
}

Assistant:

typename Octree<PointT, ContainerT>::Octant* Octree<PointT, ContainerT>::createOctant(float x, float y, float z,
                                                                                      float extent, uint32_t startIdx,
                                                                                      uint32_t endIdx, uint32_t size)
{
  // For a leaf we don't have to change anything; points are already correctly linked or correctly reordered.
  Octant* octant = new Octant;

  octant->isLeaf = true;

  octant->x = x;
  octant->y = y;
  octant->z = z;
  octant->extent = extent;

  octant->start = startIdx;
  octant->end = endIdx;
  octant->size = size;

  static const float factor[] = {-0.5f, 0.5f};

  // subdivide subset of points and re-link points according to Morton codes
  if (size > params_.bucketSize && extent > 2 * params_.minExtent)
  {
    octant->isLeaf = false;

    const ContainerT& points = *data_;
    std::vector<uint32_t> childStarts(8, 0);
    std::vector<uint32_t> childEnds(8, 0);
    std::vector<uint32_t> childSizes(8, 0);

    // re-link disjoint child subsets...
    uint32_t idx = startIdx;

    for (uint32_t i = 0; i < size; ++i)
    {
      const PointT& p = points[idx];

      // determine Morton code for each point...
      uint32_t mortonCode = 0;
      if (get<0>(p) > x) mortonCode |= 1;
      if (get<1>(p) > y) mortonCode |= 2;
      if (get<2>(p) > z) mortonCode |= 4;

      // set child starts and update successors...
      if (childSizes[mortonCode] == 0)
        childStarts[mortonCode] = idx;
      else
        successors_[childEnds[mortonCode]] = idx;
      childSizes[mortonCode] += 1;

      childEnds[mortonCode] = idx;
      idx = successors_[idx];
    }

    // now, we can create the child nodes...
    float childExtent = 0.5f * extent;
    bool firsttime = true;
    uint32_t lastChildIdx = 0;
    for (uint32_t i = 0; i < 8; ++i)
    {
      if (childSizes[i] == 0) continue;

      float childX = x + factor[(i & 1) > 0] * extent;
      float childY = y + factor[(i & 2) > 0] * extent;
      float childZ = z + factor[(i & 4) > 0] * extent;

      octant->child[i] = createOctant(childX, childY, childZ, childExtent, childStarts[i], childEnds[i], childSizes[i]);

      if (firsttime)
        octant->start = octant->child[i]->start;
      else
        successors_[octant->child[lastChildIdx]->end] =
            octant->child[i]->start;  // we have to ensure that also the child ends link to the next child start.

      lastChildIdx = i;
      octant->end = octant->child[i]->end;
      firsttime = false;
    }
  }

  return octant;
}